

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O0

void __thiscall QFragmentMap<QTextBlockData>::clear(QFragmentMap<QTextBlockData> *this)

{
  long lVar1;
  bool bVar2;
  QTextBlockData *this_00;
  Iterator *ctx;
  Iterator *in_RDI;
  long in_FS_OFFSET;
  Iterator it;
  Iterator *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ctx = in_RDI;
  this_01 = in_RDI;
  begin((QFragmentMap<QTextBlockData> *)&DAT_aaaaaaaaaaaaaaaa);
  while( true ) {
    bVar2 = Iterator::atEnd((Iterator *)&stack0xffffffffffffffe8);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    this_00 = Iterator::value((Iterator *)0x7d7f02);
    QTextBlockData::free(this_00,ctx);
    Iterator::operator++(this_01);
  }
  QFragmentMapData<QTextBlockData>::init
            ((QFragmentMapData<QTextBlockData> *)in_RDI,(EVP_PKEY_CTX *)ctx);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void clear() {
        for (Iterator it = begin(); !it.atEnd(); ++it)
            it.value()->free();
        data.init();
    }